

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O0

void TestClassFactory(void)

{
  pointer pAVar1;
  allocator<char> local_f9;
  string local_f8 [32];
  undefined1 local_d8 [16];
  string local_c8;
  allocator<char> local_a1;
  string local_a0 [32];
  undefined1 local_80 [8];
  unique_ptr<A,_std::default_delete<A>_> p;
  string local_60;
  undefined1 local_40 [8];
  ClassFactory cf;
  
  ClassFactory::ClassFactory((ClassFactory *)local_40);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60,"A",(allocator<char> *)&stack0xffffffffffffff9f);
  ClassFactory::Register<A>((ClassFactory *)local_40,&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff9f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_a0,"A",&local_a1);
  ClassFactory::CreateObject<A>((ClassFactory *)local_80,(string *)local_40);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator(&local_a1);
  pAVar1 = std::unique_ptr<A,_std::default_delete<A>_>::operator->
                     ((unique_ptr<A,_std::default_delete<A>_> *)local_80);
  (*(pAVar1->super_I)._vptr_I[2])();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_c8,"A",(allocator<char> *)(local_d8 + 0xf));
  ClassFactory::Register<A,int>((ClassFactory *)local_40,&local_c8);
  std::__cxx11::string::~string((string *)&local_c8);
  std::allocator<char>::~allocator((allocator<char> *)(local_d8 + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_f8,"A",&local_f9);
  ClassFactory::CreateObject<A,int>((ClassFactory *)local_d8,(string *)local_40,(int *)local_f8);
  std::unique_ptr<A,_std::default_delete<A>_>::operator=
            ((unique_ptr<A,_std::default_delete<A>_> *)local_80,
             (unique_ptr<A,_std::default_delete<A>_> *)local_d8);
  std::unique_ptr<A,_std::default_delete<A>_>::~unique_ptr
            ((unique_ptr<A,_std::default_delete<A>_> *)local_d8);
  std::__cxx11::string::~string(local_f8);
  std::allocator<char>::~allocator(&local_f9);
  pAVar1 = std::unique_ptr<A,_std::default_delete<A>_>::operator->
                     ((unique_ptr<A,_std::default_delete<A>_> *)local_80);
  (*(pAVar1->super_I)._vptr_I[2])();
  std::unique_ptr<A,_std::default_delete<A>_>::~unique_ptr
            ((unique_ptr<A,_std::default_delete<A>_> *)local_80);
  ClassFactory::~ClassFactory((ClassFactory *)local_40);
  return;
}

Assistant:

void TestClassFactory() {
    ClassFactory cf;

    cf.Register<A>("A");
    auto p = cf.CreateObject<A>("A");

    p->Say();

    cf.Register<A, int>("A");
    p = cf.CreateObject<A>("A", 123);

    p->Say();
}